

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4447fb::ConditionalExpr::printLeft(ConditionalExpr *this,OutputStream *S)

{
  StringView local_58;
  StringView local_48;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  ConditionalExpr *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  StringView::StringView(&local_28,"(");
  OutputStream::operator+=(local_18,local_28);
  Node::print(this->Cond,local_18);
  StringView::StringView(&local_38,") ? (");
  OutputStream::operator+=(local_18,local_38);
  Node::print(this->Then,local_18);
  StringView::StringView(&local_48,") : (");
  OutputStream::operator+=(local_18,local_48);
  Node::print(this->Else,local_18);
  StringView::StringView(&local_58,")");
  OutputStream::operator+=(local_18,local_58);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "(";
    Cond->print(S);
    S += ") ? (";
    Then->print(S);
    S += ") : (";
    Else->print(S);
    S += ")";
  }